

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O3

void __thiscall BitmapResult::writeRGB(BitmapResult *this,FILE *file,png_bytepp rows)

{
  png_byte *ppVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [13];
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar12;
  undefined1 auVar11 [15];
  undefined1 auVar13 [16];
  ushort local_42;
  png_bytepp local_40;
  ulong local_38;
  
  uVar9 = this->m_height;
  if (uVar9 != 0) {
    uVar8 = (ulong)this->m_width;
    local_38 = 0;
    auVar13 = _DAT_001137a0;
    local_40 = rows;
    do {
      iVar7 = (int)uVar8;
      uVar8 = 0;
      if (iVar7 != 0) {
        ppVar1 = local_40[local_38];
        uVar9 = 0;
        uVar10 = 0;
        do {
          auVar11 = ZEXT215(*(ushort *)(ppVar1 + uVar9) >> 3) & auVar13._0_15_;
          auVar2._8_7_ = 0;
          auVar2._0_8_ = SUB158(ZEXT115(0) << 0x40,7);
          auVar3._9_6_ = 0;
          auVar3._0_9_ = SUB159(auVar2 << 0x38,6);
          auVar4._10_5_ = 0;
          auVar4._0_10_ = SUB1510(auVar3 << 0x30,5);
          auVar5._11_4_ = 0;
          auVar5._0_11_ = SUB1511(auVar4 << 0x28,4);
          auVar6._1_12_ = SUB1512(auVar5 << 0x20,3);
          auVar6[0] = auVar11[1];
          uVar12 = auVar6._0_2_ * 0x40;
          local_42 = (ppVar1[(ulong)uVar9 + 2] >> 3 | uVar12) << 8 |
                     (ushort)((ushort)auVar11[0] * 0x800 | uVar12) >> 8;
          fwrite(&local_42,2,1,(FILE *)file);
          uVar10 = uVar10 + 1;
          uVar8 = (ulong)this->m_width;
          uVar9 = uVar9 + 4;
          auVar13 = _DAT_001137a0;
        } while (uVar10 < uVar8);
        uVar9 = this->m_height;
      }
      local_38 = local_38 + 1;
    } while (local_38 < uVar9);
  }
  return;
}

Assistant:

void BitmapResult::writeRGB(FILE *file, png_bytepp rows){
    for(uint32_t y=0;y<m_height;y++){
        png_bytep row = rows[y];
        for(uint32_t x=0;x<m_width;x++){
            png_bytep p = &row[x*4];
            uint16_t pixel = 0;
            //What the fuck! Why is the endianness flipped? Honestly, just shoot me at this point
            pixel |= ((uint16_t)(p[0]/8)) <<11; //r
            pixel |= ((uint16_t)(p[1]/8)) <<6; //g
            pixel |= ((uint16_t)(p[2]/8)) <<0; //b
            //there is no alpha value, duh
            pixel = ((pixel&0xff00)>>8)|((pixel&0x00ff)<<8); //flip endianness
            fwrite(&pixel,2,1,file);
        }
    }
}